

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tempseat.c
# Opt level: O1

size_t tempseat_output(Seat *seat,SeatOutputType type,void *data,size_t len)

{
  _func_void_Seat_ptr_size_t **pp_Var1;
  SeatVtable *pSVar2;
  size_t sVar3;
  SeatVtable *pSVar4;
  
  bufchain_add((bufchain *)(seat + -9),data,len);
  if ((seat[-3].vt == (SeatVtable *)0x0) || (*(SeatOutputType *)&(seat[-3].vt)->eof != type)) {
    pSVar2 = (SeatVtable *)safemalloc(1,0x18,0);
    *(SeatOutputType *)&pSVar2->eof = type;
    pSVar2->sent = (_func_void_Seat_ptr_size_t *)0x0;
    pSVar2->output = (_func_size_t_Seat_ptr_SeatOutputType_void_ptr_size_t *)0x0;
    pSVar4 = (SeatVtable *)(seat + -4);
    if (seat[-3].vt != (SeatVtable *)0x0) {
      pSVar4 = seat[-3].vt;
    }
    pSVar4->output = (_func_size_t_Seat_ptr_SeatOutputType_void_ptr_size_t *)pSVar2;
    seat[-3].vt = pSVar2;
  }
  pp_Var1 = &(seat[-3].vt)->sent;
  *pp_Var1 = *pp_Var1 + len;
  sVar3 = bufchain_size((bufchain *)(seat + -9));
  return sVar3;
}

Assistant:

static size_t tempseat_output(Seat *seat, SeatOutputType type,
                              const void *data, size_t len)
{
    TempSeat *ts = container_of(seat, TempSeat, seat);

    bufchain_add(&ts->output, data, len);

    if (!(ts->outchunk_tail && ts->outchunk_tail->type == type)) {
        struct output_chunk *new_chunk = snew(struct output_chunk);

        new_chunk->type = type;
        new_chunk->size = 0;

        new_chunk->next = NULL;
        if (ts->outchunk_tail)
            ts->outchunk_tail->next = new_chunk;
        else
            ts->outchunk_head = new_chunk;
        ts->outchunk_tail = new_chunk;
    }
    ts->outchunk_tail->size += len;

    return bufchain_size(&ts->output);
}